

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

bool MemoryProfiler::IsTraceEnabled(bool isRecycler)

{
  bool bVar1;
  bool bVar2;
  Phase PVar3;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,TraceMemoryFlag);
  if (bVar1) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d05c0,AllPhase);
    bVar1 = true;
    if (!bVar2) {
      if (isRecycler) {
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015d05c0,RecyclerPhase);
        return bVar1;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d05c0,RunPhase);
      if (!bVar2) {
        PVar3 = Js::Phases::GetFirstPhase((Phases *)&DAT_015d05c0);
        bVar1 = PVar3 == InvalidPhase;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
MemoryProfiler::IsTraceEnabled(bool isRecycler)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return false;
    }

    if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase))
    {
        return true;
    }

    if (!isRecycler)
    {
        return (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase)
            || Js::Configuration::Global.flags.TraceMemory.GetFirstPhase() == Js::InvalidPhase);
    }

    return Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RecyclerPhase);
}